

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O0

void Gia_ObjCollapseDeref(Gia_Man_t *p,DdManager *dd,Vec_Ptr_t *vFuncs,int Id)

{
  int iVar1;
  DdNode *n;
  int Id_local;
  Vec_Ptr_t *vFuncs_local;
  DdManager *dd_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjRefDecId(p,Id);
  if (iVar1 == 0) {
    n = (DdNode *)Vec_PtrEntry(vFuncs,Id);
    Cudd_RecursiveDeref(dd,n);
    Vec_PtrWriteEntry(vFuncs,Id,(void *)0x0);
  }
  return;
}

Assistant:

void Gia_ObjCollapseDeref( Gia_Man_t * p, DdManager * dd, Vec_Ptr_t * vFuncs, int Id )
{
    if ( Gia_ObjRefDecId(p, Id) )
        return;
    Cudd_RecursiveDeref( dd, (DdNode *)Vec_PtrEntry(vFuncs, Id) );
    Vec_PtrWriteEntry( vFuncs, Id, NULL );
}